

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O2

void __thiscall
xray_re::xr_writer::
w_seq<std::vector<xray_re::xr_surfmap*,std::allocator<xray_re::xr_surfmap*>>,write_surfmap>
          (xr_writer *this,undefined8 *container)

{
  undefined8 *puVar1;
  write_surfmap local_21;
  
  puVar1 = (undefined8 *)container[1];
  for (container = (undefined8 *)*container; container != puVar1; container = container + 1) {
    write_surfmap::operator()(&local_21,(xr_surfmap *)*container,this);
  }
  return;
}

Assistant:

inline void xr_writer::w_seq(const T& container, F write)
{
	for (typename T::const_iterator it = container.begin(),
			end = container.end(); it != end; ++it) {
		write(*it, *this);
	}
}